

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.h
# Opt level: O3

t_object *
xemmai::
f_new_value<xemmai::t_object*,xemmai::t_value<xemmai::t_pointer>,xemmai::t_value<xemmai::t_pointer>>
          (t_type *a_type,t_object **a_xs,t_value<xemmai::t_pointer> *a_xs_1,
          t_value<xemmai::t_pointer> *a_xs_2)

{
  t_queue<128UL> *this;
  t_queue<256UL> *this_00;
  long *plVar1;
  undefined8 *puVar2;
  long *plVar3;
  t_object *ptVar4;
  
  if (a_type->v_fields_offset != 0x48) {
    __assert_fail("a_type->v_fields_offset == t_object::f_fields_offset(0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/shin1m[P]xemmai/include/xemmai/engine.h"
                  ,0x173,
                  "t_object *xemmai::f_new_value(t_type *, auto &&...) [a_xs:auto = <xemmai::t_object *, xemmai::t_value<xemmai::t_pointer>, xemmai::t_value<xemmai::t_pointer>>]"
                 );
  }
  if (a_type->v_instance_fields == 3) {
    plVar1 = (long *)__tls_get_addr(&PTR_0011ede0);
    ptVar4 = (t_object *)*plVar1;
    if (ptVar4 == (t_object *)0x0) {
      plVar3 = (long *)__tls_get_addr(&PTR_0011ed28);
      ptVar4 = t_heap<xemmai::t_object>::t_of<0UL,_65536UL>::f_allocate
                         ((t_of<0UL,_65536UL> *)(*plVar3 + 0x90),
                          (t_heap<xemmai::t_object> *)(*plVar3 + 0x30));
    }
    *plVar1 = (long)ptVar4->v_next;
    ptVar4->v_next = (t_object *)0x0;
    t_slot::t_slot((t_slot *)ptVar4->v_data,*a_xs);
    t_slot::t_slot((t_slot *)(ptVar4->v_data + 0x10),(a_xs_1->super_t_pointer).v_p);
    *(anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 *)(ptVar4->v_data + 0x18) =
         a_xs_1->field_0;
    t_slot::t_slot((t_slot *)(ptVar4->v_data + 0x20),(a_xs_2->super_t_pointer).v_p);
    *(anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 *)(ptVar4->v_data + 0x28) =
         a_xs_2->field_0;
    puVar2 = (undefined8 *)__tls_get_addr(&PTR_0011ed00);
    this = (t_queue<128UL> *)*puVar2;
    *this->v_head = (t_object *)&a_type[-1].f_less;
    if (this->v_head == this->v_next) {
      t_slot::t_queue<128UL>::f_next(this);
    }
    else {
      this->v_head = this->v_head + 1;
    }
    ptVar4->v_type = a_type;
    puVar2 = (undefined8 *)__tls_get_addr(&PTR_0011ed50);
    this_00 = (t_queue<256UL> *)*puVar2;
    *this_00->v_head = ptVar4;
    if (this_00->v_head == this_00->v_next) {
      t_slot::t_queue<256UL>::f_next(this_00);
    }
    else {
      this_00->v_head = this_00->v_head + 1;
    }
    return ptVar4;
  }
  __assert_fail("a_type->v_instance_fields == sizeof...(a_xs)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/shin1m[P]xemmai/include/xemmai/engine.h"
                ,0x174,
                "t_object *xemmai::f_new_value(t_type *, auto &&...) [a_xs:auto = <xemmai::t_object *, xemmai::t_value<xemmai::t_pointer>, xemmai::t_value<xemmai::t_pointer>>]"
               );
}

Assistant:

inline t_object* f_new_value(t_type* a_type, auto&&... a_xs)
{
	assert(a_type->v_fields_offset == t_object::f_fields_offset(0));
	assert(a_type->v_instance_fields == sizeof...(a_xs));
	auto p = f_engine()->f_allocate(sizeof(t_svalue) * sizeof...(a_xs));
	f__construct(p->f_fields(0), std::make_index_sequence<sizeof...(a_xs)>(), std::forward<decltype(a_xs)>(a_xs)...);
	p->f_be(a_type);
	return p;
}